

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractNumericFacetValidator.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::AbstractNumericFacetValidator::inspectFacetBase
          (AbstractNumericFacetValidator *this,MemoryManager *manager)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  DatatypeValidator *pDVar4;
  DatatypeValidator *pDVar5;
  XMLNumber *pXVar6;
  XMLNumber *pXVar7;
  XMLNumber *pXVar8;
  XMLNumber *pXVar9;
  long *plVar10;
  long *plVar11;
  long *plVar12;
  long *plVar13;
  int iVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  InvalidDatatypeFacetException *this_00;
  undefined4 extraout_var_24;
  XMLCh *pXVar15;
  char cVar16;
  char local_3c;
  
  pDVar4 = (this->super_DatatypeValidator).fBaseValidator;
  uVar1 = (this->super_DatatypeValidator).fFacetsDefined;
  pDVar5 = pDVar4;
  if (uVar1 == 0) {
    if (pDVar4 == (DatatypeValidator *)0x0) {
      return;
    }
    pDVar5 = (DatatypeValidator *)this->fEnumeration;
  }
  if (pDVar5 != (DatatypeValidator *)0x0) {
    uVar2 = pDVar4->fFacetsDefined;
    uVar3 = pDVar4->fFixed;
    pXVar6 = this->fMaxInclusive;
    pXVar7 = this->fMaxExclusive;
    pXVar8 = this->fMinInclusive;
    pXVar9 = this->fMinExclusive;
    plVar10 = *(long **)&pDVar4[1].fAnonymous;
    plVar11 = *(long **)&pDVar4[1].fFinalSet;
    plVar12 = *(long **)&pDVar4[1].fFixed;
    plVar13 = *(long **)&pDVar4[1].fOrdered;
    cVar16 = (char)uVar2;
    if ((uVar1 & 0x20) != 0) {
      if ((uVar2 & 0x20) != 0) {
        iVar14 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                           (this,pXVar6,plVar10);
        if (((uVar3 & 0x20) != 0) && (iVar14 != 0)) {
          this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
          iVar14 = (*(pXVar6->super_XSerializable)._vptr_XSerializable[6])();
          pXVar15 = (XMLCh *)(**(code **)(*plVar10 + 0x30))();
          InvalidDatatypeFacetException::InvalidDatatypeFacetException
                    (this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                     ,0x187,FACET_maxIncl_base_fixed,(XMLCh *)CONCAT44(extraout_var_09,iVar14),
                     pXVar15,(XMLCh *)0x0,(XMLCh *)0x0,manager);
          goto LAB_002f8420;
        }
        if (iVar14 - 1U < 2) {
          this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
          iVar14 = (*(pXVar6->super_XSerializable)._vptr_XSerializable[6])();
          pXVar15 = (XMLCh *)(**(code **)(*plVar10 + 0x30))();
          InvalidDatatypeFacetException::InvalidDatatypeFacetException
                    (this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                     ,399,FACET_maxIncl_base_maxIncl,(XMLCh *)CONCAT44(extraout_var_11,iVar14),
                     pXVar15,(XMLCh *)0x0,(XMLCh *)0x0,manager);
          goto LAB_002f8420;
        }
      }
      if (((uVar2 & 0x40) != 0) &&
         (iVar14 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                             (this,pXVar6,plVar11), iVar14 != -1)) {
        this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        iVar14 = (*(pXVar6->super_XSerializable)._vptr_XSerializable[6])();
        pXVar15 = (XMLCh *)(**(code **)(*plVar11 + 0x30))();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                   ,0x19c,FACET_maxIncl_base_maxExcl,(XMLCh *)CONCAT44(extraout_var_12,iVar14),
                   pXVar15,(XMLCh *)0x0,(XMLCh *)0x0,manager);
        goto LAB_002f8420;
      }
      if ((cVar16 < '\0') &&
         ((iVar14 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                              (this,pXVar6,plVar12), iVar14 == 2 || (iVar14 == -1)))) {
        this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        iVar14 = (*(pXVar6->super_XSerializable)._vptr_XSerializable[6])();
        pXVar15 = (XMLCh *)(**(code **)(*plVar12 + 0x30))();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                   ,0x1a9,FACET_maxIncl_base_minIncl,(XMLCh *)CONCAT44(extraout_var_05,iVar14),
                   pXVar15,(XMLCh *)0x0,(XMLCh *)0x0,manager);
        goto LAB_002f8420;
      }
      if (((uVar2 >> 8 & 1) != 0) &&
         (iVar14 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                             (this,pXVar6,plVar13), iVar14 != 1)) {
        this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        iVar14 = (*(pXVar6->super_XSerializable)._vptr_XSerializable[6])();
        pXVar15 = (XMLCh *)(**(code **)(*plVar13 + 0x30))();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                   ,0x1b5,FACET_maxIncl_base_minExcl,(XMLCh *)CONCAT44(extraout_var_13,iVar14),
                   pXVar15,(XMLCh *)0x0,(XMLCh *)0x0,manager);
        goto LAB_002f8420;
      }
    }
    if ((uVar1 & 0x40) != 0) {
      if ((uVar2 & 0x40) == 0) {
        iVar14 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[5])(pXVar7);
        (*(pDVar4->super_XSerializable)._vptr_XSerializable[0x11])
                  (pDVar4,CONCAT44(extraout_var,iVar14),0,0,manager);
      }
      else {
        iVar14 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                           (this,pXVar7,plVar11);
        if (((uVar3 & 0x40) != 0) && (iVar14 != 0)) {
          this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
          iVar14 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[6])(pXVar7);
          pXVar15 = (XMLCh *)(**(code **)(*plVar11 + 0x30))();
          InvalidDatatypeFacetException::InvalidDatatypeFacetException
                    (this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                     ,0x1cd,FACET_maxExcl_base_fixed,(XMLCh *)CONCAT44(extraout_var_10,iVar14),
                     pXVar15,(XMLCh *)0x0,(XMLCh *)0x0,manager);
          goto LAB_002f8420;
        }
        if (iVar14 - 1U < 2) {
          this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
          iVar14 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[6])(pXVar7);
          pXVar15 = (XMLCh *)(**(code **)(*plVar11 + 0x30))();
          InvalidDatatypeFacetException::InvalidDatatypeFacetException
                    (this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                     ,0x1d5,FACET_maxExcl_base_maxExcl,(XMLCh *)CONCAT44(extraout_var_14,iVar14),
                     pXVar15,(XMLCh *)0x0,(XMLCh *)0x0,manager);
          goto LAB_002f8420;
        }
        if (iVar14 != 0) {
          iVar14 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[5])(pXVar7);
          (*(pDVar4->super_XSerializable)._vptr_XSerializable[0x11])
                    (pDVar4,CONCAT44(extraout_var_00,iVar14),0,0,manager);
        }
      }
      if (((uVar2 & 0x20) != 0) &&
         (iVar14 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                             (this,pXVar7,plVar10), iVar14 - 1U < 2)) {
        this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        iVar14 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[6])(pXVar7);
        pXVar15 = (XMLCh *)(**(code **)(*plVar10 + 0x30))();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                   ,0x1f9,FACET_maxExcl_base_maxIncl,(XMLCh *)CONCAT44(extraout_var_16,iVar14),
                   pXVar15,(XMLCh *)0x0,(XMLCh *)0x0,manager);
        goto LAB_002f8420;
      }
      if (((uVar2 >> 8 & 1) != 0) &&
         (iVar14 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                             (this,pXVar7,plVar13), iVar14 != 1)) {
        this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        iVar14 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[6])(pXVar7);
        pXVar15 = (XMLCh *)(**(code **)(*plVar13 + 0x30))();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                   ,0x205,FACET_maxExcl_base_minExcl,(XMLCh *)CONCAT44(extraout_var_17,iVar14),
                   pXVar15,(XMLCh *)0x0,(XMLCh *)0x0,manager);
        goto LAB_002f8420;
      }
      if ((cVar16 < '\0') &&
         (iVar14 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                             (this,pXVar7,plVar12), iVar14 != 1)) {
        this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        iVar14 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[6])(pXVar7);
        pXVar15 = (XMLCh *)(**(code **)(*plVar12 + 0x30))();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                   ,0x211,FACET_maxExcl_base_minIncl,(XMLCh *)CONCAT44(extraout_var_18,iVar14),
                   pXVar15,(XMLCh *)0x0,(XMLCh *)0x0,manager);
        goto LAB_002f8420;
      }
    }
    if ((uVar1 >> 8 & 1) != 0) {
      if ((uVar2 >> 8 & 1) == 0) {
        iVar14 = (*(pXVar9->super_XSerializable)._vptr_XSerializable[5])(pXVar9);
        (*(pDVar4->super_XSerializable)._vptr_XSerializable[0x11])
                  (pDVar4,CONCAT44(extraout_var_01,iVar14),0,0,manager);
      }
      else {
        iVar14 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                           (this,pXVar9,plVar13);
        if (((uVar3 >> 8 & 1) != 0) && (iVar14 != 0)) {
          this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
          iVar14 = (*(pXVar9->super_XSerializable)._vptr_XSerializable[6])(pXVar9);
          pXVar15 = (XMLCh *)(**(code **)(*plVar13 + 0x30))();
          InvalidDatatypeFacetException::InvalidDatatypeFacetException
                    (this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                     ,0x228,FACET_minExcl_base_fixed,(XMLCh *)CONCAT44(extraout_var_15,iVar14),
                     pXVar15,(XMLCh *)0x0,(XMLCh *)0x0,manager);
          goto LAB_002f8420;
        }
        if ((iVar14 == 2) || (iVar14 == -1)) {
          this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
          iVar14 = (*(pXVar9->super_XSerializable)._vptr_XSerializable[6])(pXVar9);
          pXVar15 = (XMLCh *)(**(code **)(*plVar13 + 0x30))();
          InvalidDatatypeFacetException::InvalidDatatypeFacetException
                    (this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                     ,0x230,FACET_minExcl_base_minExcl,(XMLCh *)CONCAT44(extraout_var_06,iVar14),
                     pXVar15,(XMLCh *)0x0,(XMLCh *)0x0,manager);
          goto LAB_002f8420;
        }
        if (iVar14 != 0) {
          iVar14 = (*(pXVar9->super_XSerializable)._vptr_XSerializable[5])(pXVar9);
          (*(pDVar4->super_XSerializable)._vptr_XSerializable[0x11])
                    (pDVar4,CONCAT44(extraout_var_02,iVar14),0,0,manager);
        }
      }
      if (((uVar2 & 0x20) != 0) &&
         (iVar14 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                             (this,pXVar9,plVar10), iVar14 - 1U < 2)) {
        this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        iVar14 = (*(pXVar9->super_XSerializable)._vptr_XSerializable[6])(pXVar9);
        pXVar15 = (XMLCh *)(**(code **)(*plVar10 + 0x30))();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                   ,0x256,FACET_minExcl_base_maxIncl,(XMLCh *)CONCAT44(extraout_var_20,iVar14),
                   pXVar15,(XMLCh *)0x0,(XMLCh *)0x0,manager);
        goto LAB_002f8420;
      }
      if ((cVar16 < '\0') &&
         ((iVar14 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                              (this,pXVar9,plVar12), iVar14 == 2 || (iVar14 == -1)))) {
        this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        iVar14 = (*(pXVar9->super_XSerializable)._vptr_XSerializable[6])(pXVar9);
        pXVar15 = (XMLCh *)(**(code **)(*plVar12 + 0x30))();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                   ,0x262,FACET_minExcl_base_minIncl,(XMLCh *)CONCAT44(extraout_var_08,iVar14),
                   pXVar15,(XMLCh *)0x0,(XMLCh *)0x0,manager);
        goto LAB_002f8420;
      }
      if (((uVar2 & 0x40) != 0) &&
         (iVar14 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                             (this,pXVar9,plVar11), iVar14 != -1)) {
        this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        iVar14 = (*(pXVar9->super_XSerializable)._vptr_XSerializable[6])(pXVar9);
        pXVar15 = (XMLCh *)(**(code **)(*plVar11 + 0x30))();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                   ,0x26e,FACET_minExcl_base_maxExcl,(XMLCh *)CONCAT44(extraout_var_23,iVar14),
                   pXVar15,(XMLCh *)0x0,(XMLCh *)0x0,manager);
        goto LAB_002f8420;
      }
    }
    if ((char)uVar1 < '\0') {
      if (cVar16 < '\0') {
        iVar14 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                           (this,pXVar8,plVar12);
        local_3c = (char)uVar3;
        if ((local_3c < '\0') && (iVar14 != 0)) {
          this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
          iVar14 = (*(pXVar8->super_XSerializable)._vptr_XSerializable[6])(pXVar8);
          pXVar15 = (XMLCh *)(**(code **)(*plVar12 + 0x30))();
          InvalidDatatypeFacetException::InvalidDatatypeFacetException
                    (this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                     ,0x287,FACET_minIncl_base_fixed,(XMLCh *)CONCAT44(extraout_var_19,iVar14),
                     pXVar15,(XMLCh *)0x0,(XMLCh *)0x0,manager);
          goto LAB_002f8420;
        }
        if ((iVar14 == 2) || (iVar14 == -1)) {
          this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
          iVar14 = (*(pXVar8->super_XSerializable)._vptr_XSerializable[6])(pXVar8);
          pXVar15 = (XMLCh *)(**(code **)(*plVar12 + 0x30))();
          InvalidDatatypeFacetException::InvalidDatatypeFacetException
                    (this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                     ,0x28f,FACET_minIncl_base_minIncl,(XMLCh *)CONCAT44(extraout_var_07,iVar14),
                     pXVar15,(XMLCh *)0x0,(XMLCh *)0x0,manager);
          goto LAB_002f8420;
        }
      }
      if (((uVar2 & 0x20) != 0) &&
         (iVar14 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                             (this,pXVar8,plVar10), iVar14 - 1U < 2)) {
        this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        iVar14 = (*(pXVar8->super_XSerializable)._vptr_XSerializable[6])(pXVar8);
        pXVar15 = (XMLCh *)(**(code **)(*plVar10 + 0x30))();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                   ,0x29b,FACET_minIncl_base_maxIncl,(XMLCh *)CONCAT44(extraout_var_21,iVar14),
                   pXVar15,(XMLCh *)0x0,(XMLCh *)0x0,manager);
LAB_002f8420:
        __cxa_throw(this_00,&InvalidDatatypeFacetException::typeinfo,XMLException::~XMLException);
      }
      if (((uVar2 >> 8 & 1) != 0) &&
         (iVar14 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                             (this,pXVar8,plVar13), iVar14 != 1)) {
        this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        iVar14 = (*(pXVar8->super_XSerializable)._vptr_XSerializable[6])(pXVar8);
        pXVar15 = (XMLCh *)(**(code **)(*plVar13 + 0x30))();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                   ,0x2a7,FACET_minIncl_base_minExcl,(XMLCh *)CONCAT44(extraout_var_22,iVar14),
                   pXVar15,(XMLCh *)0x0,(XMLCh *)0x0,manager);
        goto LAB_002f8420;
      }
      if (((uVar2 & 0x40) != 0) &&
         (iVar14 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                             (this,pXVar8,plVar11), iVar14 != -1)) {
        this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        iVar14 = (*(pXVar8->super_XSerializable)._vptr_XSerializable[6])(pXVar8);
        pXVar15 = (XMLCh *)(**(code **)(*plVar11 + 0x30))();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                   ,0x2b3,FACET_minIncl_base_maxExcl,(XMLCh *)CONCAT44(extraout_var_24,iVar14),
                   pXVar15,(XMLCh *)0x0,(XMLCh *)0x0,manager);
        goto LAB_002f8420;
      }
    }
    (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0xf])(this,manager);
    if (((uVar1 & 0x10) != 0) && (this->fStrEnumeration != (RefArrayVectorOf<char16_t> *)0x0)) {
      (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x16])(this,manager)
      ;
    }
    if ((uVar1 & 0x20) != 0) {
      iVar14 = (*(pXVar6->super_XSerializable)._vptr_XSerializable[5])();
      (*(pDVar4->super_XSerializable)._vptr_XSerializable[0x11])
                (pDVar4,CONCAT44(extraout_var_03,iVar14),0,0,manager);
    }
    if ((char)uVar1 < '\0') {
      iVar14 = (*(pXVar8->super_XSerializable)._vptr_XSerializable[5])(pXVar8);
      (*(pDVar4->super_XSerializable)._vptr_XSerializable[0x11])
                (pDVar4,CONCAT44(extraout_var_04,iVar14),0,0,manager);
    }
  }
  return;
}

Assistant:

void AbstractNumericFacetValidator::inspectFacetBase(MemoryManager* const manager)
{

    AbstractNumericFacetValidator* numBase = (AbstractNumericFacetValidator*) getBaseValidator();
    int thisFacetsDefined = getFacetsDefined();

    if ( (!thisFacetsDefined && !fEnumeration) ||
         !numBase           )
        return;

    int baseFacetsDefined = numBase->getFacetsDefined();

    XMLNumber *thisMaxInclusive = getMaxInclusive();
    XMLNumber *thisMaxExclusive = getMaxExclusive();
    XMLNumber *thisMinInclusive = getMinInclusive();
    XMLNumber *thisMinExclusive = getMinExclusive();

    XMLNumber *baseMaxInclusive = numBase->getMaxInclusive();
    XMLNumber *baseMaxExclusive = numBase->getMaxExclusive();
    XMLNumber *baseMinInclusive = numBase->getMinInclusive();
    XMLNumber *baseMinExclusive = numBase->getMinExclusive();
    int       baseFixed = numBase->getFixed();

                //                                     this
                //                 minExclusive                          maxExclusive
                //                    minInclusive                  maxInclusive
                //
                //                                     base
                //  minExclusive                                                          maxExclusive
                //      minInclusive                                                   maxInclusive
                //

    // check 4.3.7.c2 error:
    // maxInclusive > base.maxInclusive && maxInclusive != base.maxInclusive if (base.fixed)
    // maxInclusive >= base.maxExclusive
    // maxInclusive < base.minInclusive
    // maxInclusive <= base.minExclusive

    if ((thisFacetsDefined & DatatypeValidator::FACET_MAXINCLUSIVE) != 0)
    {
        if ((baseFacetsDefined & DatatypeValidator::FACET_MAXINCLUSIVE) != 0)
        {
            int result = compareValues(thisMaxInclusive, baseMaxInclusive);

            if (((baseFixed & DatatypeValidator::FACET_MAXINCLUSIVE) != 0) &&
                 (result != 0 ))
            {
                REPORT_FACET_ERROR(thisMaxInclusive
                                 , baseMaxInclusive
                                 , XMLExcepts::FACET_maxIncl_base_fixed
                                 , manager)
            }

            if (result == 1 || result == INDETERMINATE)
            {
                REPORT_FACET_ERROR(thisMaxInclusive
                                 , baseMaxInclusive
                                 , XMLExcepts::FACET_maxIncl_base_maxIncl
                                 , manager)
            }

        }

        if ((baseFacetsDefined & DatatypeValidator::FACET_MAXEXCLUSIVE) != 0)
        {
            int result = compareValues(thisMaxInclusive, baseMaxExclusive);
            if (result != -1 )
            {
                REPORT_FACET_ERROR(thisMaxInclusive
                                 , baseMaxExclusive
                                 , XMLExcepts::FACET_maxIncl_base_maxExcl
                                 , manager)
            }
        }


        if ((baseFacetsDefined & DatatypeValidator::FACET_MININCLUSIVE) != 0)
        {
            int result = compareValues(thisMaxInclusive, baseMinInclusive);
            if (result == -1 || result == INDETERMINATE)
            {
                REPORT_FACET_ERROR(thisMaxInclusive
                                 , baseMinInclusive
                                 , XMLExcepts::FACET_maxIncl_base_minIncl
                                 , manager)
            }
        }

        if ((baseFacetsDefined & DatatypeValidator::FACET_MINEXCLUSIVE) != 0)
        {
            int result = compareValues(thisMaxInclusive, baseMinExclusive);
            if (result != 1 )
            {
                REPORT_FACET_ERROR(thisMaxInclusive
                                 , baseMinExclusive
                                 , XMLExcepts::FACET_maxIncl_base_minExcl
                                 , manager)
            }
        }

    }

    // check 4.3.8.c3 error:
    // maxExclusive > base.maxExclusive  && maxExclusive != base.maxExclusive if (base.fixed)
    // maxExclusive > base.maxInclusive
    // maxExclusive <= base.minInclusive
    // maxExclusive <= base.minExclusive

    if ((thisFacetsDefined & DatatypeValidator::FACET_MAXEXCLUSIVE) != 0)
    {
        if (( baseFacetsDefined & DatatypeValidator::FACET_MAXEXCLUSIVE) != 0)
        {
            int result = compareValues(thisMaxExclusive, baseMaxExclusive);

            if (((baseFixed & DatatypeValidator::FACET_MAXEXCLUSIVE) != 0) &&
                 (result != 0 ))
            {
                REPORT_FACET_ERROR(thisMaxExclusive
                                 , baseMaxExclusive
                                 , XMLExcepts::FACET_maxExcl_base_fixed
                                 , manager)
             }

            if (result == 1 || result == INDETERMINATE)
            {
                REPORT_FACET_ERROR(thisMaxExclusive
                                 , baseMaxExclusive
                                 , XMLExcepts::FACET_maxExcl_base_maxExcl
                                 , manager)
            }

            /**
             * Schema Errata
             * E2-16 maxExclusive
             *
             *   derived type's maxExclusive must either be
             *   1) equal to base' maxExclusive or
             *   2) from the base type value space
             *
             */
            if (result != 0)
            {
                FROM_BASE_VALUE_SPACE(thisMaxExclusive
                        , DatatypeValidator::FACET_MAXEXCLUSIVE
                        , XMLExcepts::FACET_maxExcl_notFromBase
                        , manager)
            }
        }
        else  // base has no maxExclusive
        {
            FROM_BASE_VALUE_SPACE(thisMaxExclusive
                        , DatatypeValidator::FACET_MAXEXCLUSIVE
                        , XMLExcepts::FACET_maxExcl_notFromBase
                        , manager)
        }

        if (( baseFacetsDefined & DatatypeValidator::FACET_MAXINCLUSIVE) != 0)
        {
            int result = compareValues(thisMaxExclusive, baseMaxInclusive);
            if (result == 1 || result == INDETERMINATE)
            {
                REPORT_FACET_ERROR(thisMaxExclusive
                                 , baseMaxInclusive
                                 , XMLExcepts::FACET_maxExcl_base_maxIncl
                                 , manager)
            }
        }

        if (( baseFacetsDefined & DatatypeValidator::FACET_MINEXCLUSIVE) != 0)
        {
            int result = compareValues(thisMaxExclusive, baseMinExclusive);
            if (result != 1)
            {
                REPORT_FACET_ERROR(thisMaxExclusive
                                 , baseMinExclusive
                                 , XMLExcepts::FACET_maxExcl_base_minExcl
                                 , manager)
            }
        }

        if (( baseFacetsDefined & DatatypeValidator::FACET_MININCLUSIVE) != 0)
        {
            int result = compareValues(thisMaxExclusive, baseMinInclusive);
            if (result != 1)
            {
                REPORT_FACET_ERROR(thisMaxExclusive
                                 , baseMinInclusive
                                 , XMLExcepts::FACET_maxExcl_base_minIncl
                                 , manager)
            }
        }
    }

    // check 4.3.9.c3 error:
    // minExclusive < base.minExclusive     minExclusive != base.minExclusive if (base.fixed)
    // minExclusive > base.maxInclusive ??? minExclusive >= base.maxInclusive
    // minExclusive < base.minInclusive
    // minExclusive >= base.maxExclusive

    if ((thisFacetsDefined & DatatypeValidator::FACET_MINEXCLUSIVE) != 0)
    {
        if (( baseFacetsDefined & DatatypeValidator::FACET_MINEXCLUSIVE) != 0)
        {
            int result = compareValues(thisMinExclusive, baseMinExclusive);

            if (((baseFixed & DatatypeValidator::FACET_MINEXCLUSIVE) != 0) &&
                 (result != 0 ))
            {
                REPORT_FACET_ERROR(thisMinExclusive
                                 , baseMinExclusive
                                 , XMLExcepts::FACET_minExcl_base_fixed
                                 , manager)
            }

            if (result == -1 || result == INDETERMINATE)
            {
                REPORT_FACET_ERROR(thisMinExclusive
                                 , baseMinExclusive
                                 , XMLExcepts::FACET_minExcl_base_minExcl
                                 , manager)
            }

            /**
             * Schema Errata
             * E2-16 maxExclusive
             *
             *   derived type's minExclusive must either be
             *   1) equal to base' minxExclusive or
             *   2) from the base type value space
             *
             *  Note: deduced from, not explicitly expressed in the Errata
             */
            if (result != 0)
            {
                FROM_BASE_VALUE_SPACE(thisMinExclusive
                        , DatatypeValidator::FACET_MINEXCLUSIVE
                        , XMLExcepts::FACET_minExcl_notFromBase
                        , manager)
            }
        }
        else // base has no minExclusive
        {

            FROM_BASE_VALUE_SPACE(thisMinExclusive
                        , DatatypeValidator::FACET_MINEXCLUSIVE
                        , XMLExcepts::FACET_minExcl_notFromBase
                        , manager)
        }

        if (( baseFacetsDefined & DatatypeValidator::FACET_MAXINCLUSIVE) != 0)
        {
            int result = compareValues(thisMinExclusive, baseMaxInclusive);
            if (result == 1 || result == INDETERMINATE)
            {
                REPORT_FACET_ERROR(thisMinExclusive
                                 , baseMaxInclusive
                                 , XMLExcepts::FACET_minExcl_base_maxIncl
                                 , manager)
            }
        }

        if (( baseFacetsDefined & DatatypeValidator::FACET_MININCLUSIVE) != 0)
        {
            int result = compareValues(thisMinExclusive, baseMinInclusive);
            if (result == -1 || result == INDETERMINATE)
            {
                REPORT_FACET_ERROR(thisMinExclusive
                                 , baseMinInclusive
                                 , XMLExcepts::FACET_minExcl_base_minIncl
                                 , manager)
            }
        }

        if (( baseFacetsDefined & DatatypeValidator::FACET_MAXEXCLUSIVE) != 0)
        {
            int result = compareValues(thisMinExclusive, baseMaxExclusive);
            if (result != -1)
            {
                REPORT_FACET_ERROR(thisMinExclusive
                                 , baseMaxExclusive
                                 , XMLExcepts::FACET_minExcl_base_maxExcl
                                 , manager)
            }
        }

    }

    // check 4.3.10.c2 error:
    // minInclusive < base.minInclusive   minInclusive != base.minInclusive if (base.fixed)
    // minInclusive > base.maxInclusive
    // minInclusive <= base.minExclusive
    // minInclusive >= base.maxExclusive


    if ((thisFacetsDefined & DatatypeValidator::FACET_MININCLUSIVE) != 0)
    {
        if ((baseFacetsDefined & DatatypeValidator::FACET_MININCLUSIVE) != 0)
        {
            int result = compareValues(thisMinInclusive, baseMinInclusive);

            if (((baseFixed & DatatypeValidator::FACET_MININCLUSIVE) != 0) &&
                 (result != 0 ))
            {
                REPORT_FACET_ERROR(thisMinInclusive
                                 , baseMinInclusive
                                 , XMLExcepts::FACET_minIncl_base_fixed
                                 , manager)
            }

            if (result == -1 || result == INDETERMINATE)
            {
                REPORT_FACET_ERROR(thisMinInclusive
                                 , baseMinInclusive
                                 , XMLExcepts::FACET_minIncl_base_minIncl
                                 , manager)
            }
        }

        if (( baseFacetsDefined & DatatypeValidator::FACET_MAXINCLUSIVE) != 0)
        {
            int result = compareValues(thisMinInclusive, baseMaxInclusive);
            if (result == 1 || result == INDETERMINATE)
            {
                REPORT_FACET_ERROR(thisMinInclusive
                                 , baseMaxInclusive
                                 , XMLExcepts::FACET_minIncl_base_maxIncl
                                 , manager)
            }
        }

        if (( baseFacetsDefined & DatatypeValidator::FACET_MINEXCLUSIVE) != 0)
        {
            int result = compareValues(thisMinInclusive, baseMinExclusive);
            if (result != 1)
            {
                REPORT_FACET_ERROR(thisMinInclusive
                                 , baseMinExclusive
                                 , XMLExcepts::FACET_minIncl_base_minExcl
                                 , manager)
            }
        }

        if (( baseFacetsDefined & DatatypeValidator::FACET_MAXEXCLUSIVE) != 0)
        {
            int result = compareValues(thisMinInclusive, baseMaxExclusive);
            if (result != -1)
            {
                REPORT_FACET_ERROR(thisMinInclusive
                                 , baseMaxExclusive
                                 , XMLExcepts::FACET_minIncl_base_maxExcl
                                 , manager)
            }
        }

    }

    checkAdditionalFacetConstraintsBase(manager);

    // check 4.3.5.c0 must: enumeration values from the value space of base
    //
    // In fact, the values in the enumeration shall go through validation
    // of this class as well.
    // this->checkContent(value, false);
    //
    if ( ((thisFacetsDefined & DatatypeValidator::FACET_ENUMERATION) != 0) &&
        ( fStrEnumeration ))
    {
        setEnumeration(manager);
    }

    //
    // maxInclusive, maxExclusive, minInclusive and minExclusive
    // shall come from the base's value space as well
    //

    FROM_BASE_VALUE_SPACE(thisMaxInclusive
                        , DatatypeValidator::FACET_MAXINCLUSIVE
                        , XMLExcepts::FACET_maxIncl_notFromBase
                        , manager)

    FROM_BASE_VALUE_SPACE(thisMinInclusive
                        , DatatypeValidator::FACET_MININCLUSIVE
                        , XMLExcepts::FACET_minIncl_notFromBase
                        , manager)

}